

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_membuf.c
# Opt level: O1

void membuff_init(membuff_t *mb,size_t initial_size)

{
  char *pcVar1;
  
  if (initial_size != 0) {
    pcVar1 = (char *)calloc(1,initial_size);
    mb->buf = pcVar1;
    if (pcVar1 != (char *)0x0) goto LAB_001366ca;
    membuff_init_cold_1();
  }
  mb->buf = (char *)0x0;
LAB_001366ca:
  mb->pos = 0;
  mb->allocated_size = initial_size;
  return;
}

Assistant:

void membuff_init(membuff_t *mb, size_t initial_size) {
  if (initial_size > 0) {
    mb->buf = (char *)calloc(1, initial_size);
    if (mb->buf == NULL) {
      fprintf(stderr, "out of memory\n");
      exit(1);
    }
  }
  else
    mb->buf = NULL;
  mb->pos = 0;
  mb->allocated_size = initial_size;
}